

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,REF_GEOM ref_geom_donor)

{
  uint uVar1;
  REF_INT *pRVar2;
  int local_28;
  REF_INT i;
  REF_STATUS ref_private_macro_code_rss;
  REF_GEOM ref_geom_donor_local;
  REF_GEOM ref_geom_recipient_local;
  
  if ((ref_geom_recipient->contex_owned != 0) &&
     (uVar1 = ref_egads_close(ref_geom_recipient), uVar1 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbd,
           "ref_geom_share_context",(ulong)uVar1,"close egads contex");
    return uVar1;
  }
  ref_geom_recipient->contex_owned = 0;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  ref_geom_recipient->nedge = ref_geom_donor->nedge;
  ref_geom_recipient->nface = ref_geom_donor->nface;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = ref_geom_donor->effective_curvature;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = ref_geom_donor->model;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = ref_geom_donor->faces;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = ref_geom_donor->nodes;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;
  if (ref_geom_donor->e2f == (REF_INT *)0x0) {
    ref_geom_recipient->e2f = (REF_INT *)0x0;
  }
  else {
    if (ref_geom_recipient->nedge * 2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2,
             "ref_geom_share_context","malloc ref_geom_recipient->e2f of REF_INT negative");
      return 1;
    }
    pRVar2 = (REF_INT *)malloc((long)(ref_geom_recipient->nedge << 1) << 2);
    ref_geom_recipient->e2f = pRVar2;
    if (ref_geom_recipient->e2f == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2,
             "ref_geom_share_context","malloc ref_geom_recipient->e2f of REF_INT NULL");
      return 2;
    }
    for (local_28 = 0;
        SBORROW4(local_28,ref_geom_recipient->nedge * 2) !=
        local_28 + ref_geom_recipient->nedge * -2 < 0; local_28 = local_28 + 1) {
      ref_geom_recipient->e2f[local_28] = ref_geom_donor->e2f[local_28];
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,
                                          REF_GEOM ref_geom_donor) {
  if (ref_geom_recipient->contex_owned)
    RSS(ref_egads_close(ref_geom_recipient), "close egads contex");

  ref_geom_recipient->contex_owned = REF_FALSE;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  ref_geom_recipient->nedge = ref_geom_donor->nedge;
  ref_geom_recipient->nface = ref_geom_donor->nface;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = ref_geom_donor->effective_curvature;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = ref_geom_donor->model;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = ref_geom_donor->faces;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = ref_geom_donor->nodes;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;

  if (NULL == ref_geom_donor->e2f) {
    ref_geom_recipient->e2f = NULL;
  } else {
    REF_INT i;
    ref_malloc(ref_geom_recipient->e2f, 2 * ref_geom_recipient->nedge, REF_INT);
    for (i = 0; i < 2 * ref_geom_recipient->nedge; i++)
      ref_geom_recipient->e2f[i] = ref_geom_donor->e2f[i];
  }

  return REF_SUCCESS;
}